

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

_Bool adt_list_remove(adt_list_t *self,void *pItem)

{
  bool bVar1;
  adt_list_elem_tag *paVar2;
  adt_list_elem_t *pIter;
  bool bVar3;
  
  if (self == (adt_list_t *)0x0) {
    return false;
  }
  paVar2 = self->pFirst;
  if (self->pFirst == (adt_list_elem_t *)0x0) {
    pIter = (adt_list_elem_t *)0x0;
  }
  else {
    do {
      pIter = paVar2;
      bVar3 = pIter->pItem == pItem;
      bVar1 = !bVar3;
      if (bVar3) goto LAB_00120c00;
      paVar2 = pIter->pNext;
    } while (pIter->pNext != (adt_list_elem_tag *)0x0);
    bVar1 = true;
LAB_00120c00:
    if (bVar1) {
      pIter = (adt_list_elem_t *)0x0;
    }
  }
  if (pIter != (adt_list_elem_t *)0x0) {
    adt_list_erase(self,pIter);
  }
  return pIter != (adt_list_elem_t *)0x0;
}

Assistant:

bool adt_list_remove(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *iter = adt_list_find(self, pItem);
      if (iter == 0)
      {
         return false;
      }
      else
      {
         adt_list_erase(self, iter);
         return true;
      }
   }
   return false;
}